

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_array_pop(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int shift)

{
  int iVar1;
  JSValueUnion JVar2;
  ulong extraout_RDX;
  ulong uVar3;
  uint uVar4;
  ulong idx;
  JSValueUnion *__dest;
  JSValueUnion JVar5;
  int64_t iVar6;
  void *pvVar7;
  JSValueUnion JVar8;
  bool bVar9;
  JSValue obj;
  JSValue v;
  JSValue val;
  int64_t len;
  ulong local_40;
  JSValueUnion local_38;
  
  obj = JS_ToObject(ctx,this_val);
  JVar2 = obj.u;
  __dest = (JSValueUnion *)ctx;
  local_38 = JVar2;
  iVar1 = js_get_length64(ctx,(int64_t *)&local_40,obj);
  JVar5 = local_38;
  uVar4 = (uint)obj.tag;
  if (iVar1 != 0) {
    v = (JSValue)(ZEXT816(3) << 0x40);
    goto LAB_001457b2;
  }
  if ((long)local_40 < 1) {
    idx = 0;
    v = (JSValue)(ZEXT816(3) << 0x40);
  }
  else {
    if (((uVar4 == 0xffffffff) && (*(short *)((long)JVar2.ptr + 6) == 2)) &&
       ((*(byte *)((long)JVar2.ptr + 5) & 8) != 0)) {
      uVar3 = (ulong)*(uint *)((long)JVar2.ptr + 0x40);
      __dest = *(JSValueUnion **)((long)JVar2.ptr + 0x38);
      bVar9 = true;
    }
    else {
      bVar9 = false;
      uVar3 = extraout_RDX;
    }
    idx = local_40 - 1;
    if ((bVar9) && (local_40 == (uVar3 & 0xffffffff))) {
      if (shift == 0) {
        uVar3 = (ulong)((int)uVar3 - 1);
        JVar8 = (JSValueUnion)__dest[uVar3 * 2].ptr;
        pvVar7 = __dest[uVar3 * 2 + 1].ptr;
      }
      else {
        JVar8 = (JSValueUnion)__dest->ptr;
        pvVar7 = __dest[1].ptr;
        memmove(__dest,__dest + 2,(ulong)((int)uVar3 - 1) << 4);
      }
      v.tag = (int64_t)pvVar7;
      v.u.float64 = JVar8.float64;
      *(int *)((long)JVar5.ptr + 0x40) = *(int *)((long)JVar5.ptr + 0x40) + -1;
    }
    else {
      if (shift == 0) {
        v = JS_GetPropertyInt64(ctx,obj,idx);
        if ((int)v.tag == 6) goto LAB_001457b2;
      }
      else {
        v = JS_GetPropertyValue(ctx,obj,(JSValue)ZEXT816(0));
        if (((int)v.tag == 6) || (iVar1 = JS_CopySubArray(ctx,obj,0,1,idx,1), iVar1 != 0))
        goto LAB_001457b2;
      }
      iVar1 = JS_DeletePropertyInt64(ctx,obj,idx,0x4000);
      if (iVar1 < 0) goto LAB_001457b2;
    }
  }
  bVar9 = (long)(int)idx == idx;
  JVar5.float64 = (double)(long)idx;
  if (bVar9) {
    JVar5.ptr = (void *)(idx & 0xffffffff);
  }
  iVar6 = 7;
  if (bVar9) {
    iVar6 = 0;
  }
  val.tag = iVar6;
  val.u.float64 = JVar5.float64;
  iVar1 = JS_SetPropertyInternal(ctx,obj,0x30,val,0x4000);
  if (-1 < iVar1) {
    if (uVar4 < 0xfffffff5) {
      return v;
    }
    iVar1 = *JVar2.ptr;
    *(int *)JVar2.ptr = iVar1 + -1;
    if (1 < iVar1) {
      return v;
    }
    __JS_FreeValueRT(ctx->rt,obj);
    return v;
  }
LAB_001457b2:
  if ((0xfffffff4 < (uint)v.tag) && (iVar1 = *v.u.ptr, *(int *)v.u.ptr = iVar1 + -1, iVar1 < 2)) {
    __JS_FreeValueRT(ctx->rt,v);
  }
  if ((0xfffffff4 < uVar4) && (iVar1 = *JVar2.ptr, *(int *)JVar2.ptr = iVar1 + -1, iVar1 < 2)) {
    __JS_FreeValueRT(ctx->rt,obj);
  }
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_array_pop(JSContext *ctx, JSValueConst this_val,
                            int argc, JSValueConst *argv, int shift)
{
    JSValue obj, res = JS_UNDEFINED;
    int64_t len, newLen;
    JSValue *arrp;
    uint32_t count32;

    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &len, obj))
        goto exception;
    newLen = 0;
    if (len > 0) {
        newLen = len - 1;
        /* Special case fast arrays */
        if (js_get_fast_array(ctx, obj, &arrp, &count32) && count32 == len) {
            JSObject *p = JS_VALUE_GET_OBJ(obj);
            if (shift) {
                res = arrp[0];
                memmove(arrp, arrp + 1, (count32 - 1) * sizeof(*arrp));
                p->u.array.count--;
            } else {
                res = arrp[count32 - 1];
                p->u.array.count--;
            }
        } else {
            if (shift) {
                res = JS_GetPropertyInt64(ctx, obj, 0);
                if (JS_IsException(res))
                    goto exception;
                if (JS_CopySubArray(ctx, obj, 0, 1, len - 1, +1))
                    goto exception;
            } else {
                res = JS_GetPropertyInt64(ctx, obj, newLen);
                if (JS_IsException(res))
                    goto exception;
            }
            if (JS_DeletePropertyInt64(ctx, obj, newLen, JS_PROP_THROW) < 0)
                goto exception;
        }
    }
    if (JS_SetProperty(ctx, obj, JS_ATOM_length, JS_NewInt64(ctx, newLen)) < 0)
        goto exception;

    JS_FreeValue(ctx, obj);
    return res;

 exception:
    JS_FreeValue(ctx, res);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}